

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QMainWindowLayoutState::itemAt(QMainWindowLayoutState *this,int index,int *x)

{
  QLayoutItem *pQVar1;
  int *in_RDX;
  undefined4 in_ESI;
  int *unaff_retaddr;
  QLayoutItem *ret_1;
  QLayoutItem *ret;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff8;
  
  pQVar1 = QToolBarAreaLayout::itemAt
                     ((QToolBarAreaLayout *)ret_1,unaff_retaddr,
                      (int)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  if ((pQVar1 == (QLayoutItem *)0x0) &&
     (pQVar1 = QDockAreaLayout::itemAt
                         ((QDockAreaLayout *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,0),
     pQVar1 == (QLayoutItem *)0x0)) {
    pQVar1 = (QLayoutItem *)0x0;
  }
  return pQVar1;
}

Assistant:

QLayoutItem *QMainWindowLayoutState::itemAt(int index, int *x) const
{
#if QT_CONFIG(toolbar)
    if (QLayoutItem *ret = toolBarAreaLayout.itemAt(x, index))
        return ret;
#endif

#if QT_CONFIG(dockwidget)
    if (QLayoutItem *ret = dockAreaLayout.itemAt(x, index))
        return ret;
#else
    if (centralWidgetItem  && (*x)++ == index)
        return centralWidgetItem;
#endif

    return nullptr;
}